

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O3

void __thiscall
capnp::QueuedClient::QueuedClient
          (QueuedClient *this,Promise<kj::Own<capnp::ClientHook>_> *promiseParam)

{
  EventLoop *pEVar1;
  PromiseNode *pPVar2;
  Own<kj::_::EagerPromiseNode<kj::_::Void>_> OVar3;
  undefined1 local_58 [8];
  EventLoop *pEStack_50;
  undefined1 local_48 [8];
  EventLoop *local_40;
  Own<kj::_::PromiseNode> local_38;
  anon_class_8_1_8991fb9c_for_errorHandler local_20;
  anon_class_8_1_8991fb9c_for_func local_18;
  
  (this->super_ClientHook)._vptr_ClientHook = (_func_int **)&PTR___cxa_pure_virtual_0037ba70;
  _::setGlobalBrokenCapFactoryForLayoutCpp
            ((BrokenCapFactory *)&(anonymous_namespace)::brokenCapFactory);
  (this->super_Refcounted).refcount = 0;
  (this->super_ClientHook)._vptr_ClientHook = (_func_int **)&PTR_newCall_0037a6b0;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&PTR_disposeImpl_0037a708;
  (this->redirect).ptr.disposer = (Disposer *)0x0;
  (this->redirect).ptr.ptr = (ClientHook *)0x0;
  kj::Promise<kj::Own<capnp::ClientHook>_>::fork
            ((Promise<kj::Own<capnp::ClientHook>_> *)&this->promise);
  kj::_::ForkHub<kj::Own<capnp::ClientHook>_>::addBranch
            ((ForkHub<kj::Own<capnp::ClientHook>_> *)local_48);
  local_20.this = this;
  local_18.this = this;
  kj::
  heap<kj::_::TransformPromiseNode<kj::_::Void,kj::Own<capnp::ClientHook>,capnp::QueuedClient::QueuedClient(kj::Promise<kj::Own<capnp::ClientHook>>&&)::_lambda(kj::Own<capnp::ClientHook>&&)_1_,capnp::QueuedClient::Promise(kj::Promise<kj::Own<capnp::ClientHook>>&&)::_lambda(kj::Exception&&)_1_>,kj::Own<kj::_::PromiseNode>,capnp::QueuedClient::QueuedClient(kj::Promise<kj::Own<capnp::ClientHook>>&&)::_lambda(kj::Own<capnp::ClientHook>&&)_1_,capnp::QueuedClient::Promise(kj::Promise<kj::Own<capnp::ClientHook>>&&)::_lambda(kj::Exception&&)_1_>
            ((kj *)local_58,(Own<kj::_::PromiseNode> *)local_48,&local_18,&local_20);
  local_38.disposer = (Disposer *)CONCAT44(local_58._4_4_,local_58._0_4_);
  local_38.ptr = (PromiseNode *)pEStack_50;
  OVar3 = kj::heap<kj::_::EagerPromiseNode<kj::_::Void>,kj::Own<kj::_::PromiseNode>>
                    ((kj *)local_58,&local_38);
  pPVar2 = local_38.ptr;
  *(undefined4 *)&(this->selfResolutionOp).super_PromiseBase.node.disposer = local_58._0_4_;
  *(undefined4 *)((long)&(this->selfResolutionOp).super_PromiseBase.node.disposer + 4) =
       local_58._4_4_;
  *(uint *)&(this->selfResolutionOp).super_PromiseBase.node.ptr = (uint)pEStack_50;
  *(undefined4 *)((long)&(this->selfResolutionOp).super_PromiseBase.node.ptr + 4) = pEStack_50._4_4_
  ;
  if ((EventLoop *)local_38.ptr != (EventLoop *)0x0) {
    local_38.ptr = (PromiseNode *)0x0;
    (**(local_38.disposer)->_vptr_Disposer)
              (local_38.disposer,
               (long)&pPVar2->_vptr_PromiseNode +
               (long)((Event *)pPVar2->_vptr_PromiseNode)[-1].prev,OVar3.ptr);
  }
  pEVar1 = local_40;
  if (local_40 != (EventLoop *)0x0) {
    local_40 = (EventLoop *)0x0;
    (**(code **)*(_func_int **)local_48)
              (local_48,(long)pEVar1->port[-2]._vptr_EventPort + (long)&pEVar1->port);
  }
  kj::_::ForkHub<kj::Own<capnp::ClientHook>_>::addBranch
            ((ForkHub<kj::Own<capnp::ClientHook>_> *)local_58);
  kj::Promise<kj::Own<capnp::ClientHook>_>::fork
            ((Promise<kj::Own<capnp::ClientHook>_> *)&this->promiseForCallForwarding);
  pEVar1 = pEStack_50;
  if (pEStack_50 != (EventLoop *)0x0) {
    pEStack_50 = (EventLoop *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_58._4_4_,local_58._0_4_))
              ((undefined8 *)CONCAT44(local_58._4_4_,local_58._0_4_),
               (long)&pEVar1->port + (long)((Event *)pEVar1->port)[-1].prev);
  }
  kj::_::ForkHub<kj::Own<capnp::ClientHook>_>::addBranch
            ((ForkHub<kj::Own<capnp::ClientHook>_> *)local_58);
  kj::Promise<kj::Own<capnp::ClientHook>_>::fork
            ((Promise<kj::Own<capnp::ClientHook>_> *)&this->promiseForClientResolution);
  pEVar1 = pEStack_50;
  if (pEStack_50 != (EventLoop *)0x0) {
    pEStack_50 = (EventLoop *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_58._4_4_,local_58._0_4_))
              ((undefined8 *)CONCAT44(local_58._4_4_,local_58._0_4_),
               (long)&pEVar1->port + (long)((Event *)pEVar1->port)[-1].prev);
  }
  return;
}

Assistant:

QueuedClient(kj::Promise<kj::Own<ClientHook>>&& promiseParam)
      : promise(promiseParam.fork()),
        selfResolutionOp(promise.addBranch().then([this](kj::Own<ClientHook>&& inner) {
          redirect = kj::mv(inner);
        }, [this](kj::Exception&& exception) {
          redirect = newBrokenCap(kj::mv(exception));
        }).eagerlyEvaluate(nullptr)),
        promiseForCallForwarding(promise.addBranch().fork()),
        promiseForClientResolution(promise.addBranch().fork()) {}